

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void detail::do_deserialize<std::__cxx11::string>
               (span<const_std::byte> *array,span<const_std::byte> *buffer)

{
  char *__dest;
  byte **ppbVar1;
  unsigned_long size;
  size_t count;
  span<const_std::byte> *buffer_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *array_local;
  
  count = (size_t)buffer;
  buffer_local = array;
  deserialize<unsigned_long>(&size,buffer);
  dynamic_array_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::resize((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer_local,size);
  __dest = array_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer_local)
  ;
  ppbVar1 = span<const_std::byte>::data((span<const_std::byte> *)count);
  memcpy(__dest,*ppbVar1,size);
  ppbVar1 = span<const_std::byte>::begin((span<const_std::byte> *)count);
  *ppbVar1 = *ppbVar1 + size;
  return;
}

Assistant:

void do_deserialize(T& array, span<std::byte const>& buffer, value_tag<serialization_category::trivial_array>) {
        size_t count;
        deserialize(count, buffer);

        using traits = dynamic_array_traits<T>;
        traits::resize(array, count);

        const auto size = count * sizeof(typename traits::value_type);
        memcpy(traits::data(array), buffer.data(), size);
        buffer.begin() += size;
    }